

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

ElementTypeAndOffset * __thiscall
choc::value::Type::Object::getElementInfo
          (ElementTypeAndOffset *__return_storage_ptr__,Object *this,uint32_t index)

{
  Content *pCVar1;
  byte bVar2;
  MainType MVar3;
  int iVar4;
  MemberNameAndType *pMVar5;
  ComplexArray *other;
  Object *other_00;
  undefined8 uVar6;
  size_t sVar7;
  Content *pCVar8;
  Object *this_00;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  
  if ((this->members).size != 0) {
    uVar12 = (ulong)index;
    lVar11 = 0x20;
    uVar9 = 0;
    sVar10 = 0;
    do {
      pMVar5 = (this->members).items;
      if (uVar12 == uVar9) {
        pCVar8 = &pMVar5[uVar12].type.content;
        MVar3 = pMVar5[uVar12].type.mainType;
        pCVar1 = &(__return_storage_ptr__->elementType).content;
        (__return_storage_ptr__->elementType).mainType = MVar3;
        (__return_storage_ptr__->elementType).allocator = (Allocator *)0x0;
        if (MVar3 == object) {
          other_00 = pCVar8->object;
          this_00 = (Object *)malloc(0x28);
          Object(this_00,(Allocator *)0x0,other_00);
        }
        else {
          if (MVar3 != complexArray) {
            uVar6 = *(undefined8 *)((long)&pMVar5[uVar12].type.content + 8);
            pCVar1->object = pCVar8->object;
            *(undefined8 *)((long)&(__return_storage_ptr__->elementType).content + 8) = uVar6;
            goto LAB_001e4a9d;
          }
          other = pCVar8->complexArray;
          this_00 = (Object *)malloc(0x18);
          ComplexArray::ComplexArray((ComplexArray *)this_00,(Allocator *)0x0,other);
        }
        pCVar1->complexArray = (ComplexArray *)this_00;
LAB_001e4a9d:
        __return_storage_ptr__->offset = sVar10;
        return __return_storage_ptr__;
      }
      bVar2 = *(byte *)((long)pMVar5 + lVar11 + -0x10);
      sVar7 = 4;
      if (bVar2 < 0x24) {
        switch(bVar2) {
        case 0:
          sVar7 = 0;
          break;
        case 1:
          sVar7 = 1;
          break;
        case 2:
        case 3:
        case 5:
        case 6:
        case 7:
switchD_001e4960_caseD_2:
          throwError("Invalid type");
        case 4:
          break;
        case 8:
switchD_001e4960_caseD_8:
          sVar7 = 8;
          break;
        default:
          if (bVar2 != 0x14) {
            if (bVar2 != 0x18) goto switchD_001e4960_caseD_2;
            goto switchD_001e4960_caseD_8;
          }
        }
      }
      else if (bVar2 < 0x40) {
        if (bVar2 != 0x24) {
          if (bVar2 != 0x30) goto switchD_001e4960_caseD_2;
          sVar7 = (ulong)*(uint *)((long)pMVar5 + lVar11 + -4) *
                  (ulong)(*(byte *)((long)pMVar5 + lVar11 + -8) & 0xf);
        }
      }
      else if (bVar2 == 0x40) {
        iVar4 = *(int *)((long)&(pMVar5->name)._M_len + lVar11);
        sVar7 = (ulong)*(uint *)((long)pMVar5 + lVar11 + -4) *
                (ulong)((iVar4 + (uint)(iVar4 == 0)) * (*(byte *)((long)pMVar5 + lVar11 + -8) & 0xf)
                       );
      }
      else if (bVar2 == 0x80) {
        sVar7 = ComplexArray::getValueDataSize(*(ComplexArray **)((long)pMVar5 + lVar11 + -8));
      }
      else {
        if (bVar2 != 0x90) goto switchD_001e4960_caseD_2;
        sVar7 = getValueDataSize(*(Object **)((long)pMVar5 + lVar11 + -8));
      }
      sVar10 = sVar10 + sVar7;
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 0x30;
    } while (uVar9 < (this->members).size);
  }
  throwError("Index out of range");
}

Assistant:

ElementTypeAndOffset getElementInfo (uint32_t index) const
    {
        size_t offset = 0;

        for (uint32_t i = 0; i < members.size; ++i)
        {
            if (i == index)
                return { members[i].type, offset };

            offset += members[i].type.getValueDataSize();
        }

        throwError ("Index out of range");
    }